

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O1

void mbedtls_mpi_free(mbedtls_mpi *X)

{
  mbedtls_mpi_uint *pmVar1;
  long lVar2;
  long lVar3;
  
  if (X != (mbedtls_mpi *)0x0) {
    pmVar1 = X->p;
    if (pmVar1 != (mbedtls_mpi_uint *)0x0) {
      lVar2 = X->n << 3;
      if (lVar2 != 0) {
        lVar3 = 0;
        do {
          *(undefined1 *)((long)pmVar1 + lVar3) = 0;
          lVar3 = lVar3 + 1;
        } while (lVar2 != lVar3);
      }
      free(X->p);
    }
    X->s = 1;
    X->n = 0;
    X->p = (mbedtls_mpi_uint *)0x0;
  }
  return;
}

Assistant:

void mbedtls_mpi_free( mbedtls_mpi *X )
{
    if( X == NULL )
        return;

    if( X->p != NULL )
    {
        mbedtls_zeroize( X->p, X->n * ciL );
        mbedtls_free( X->p );
    }

    X->s = 1;
    X->n = 0;
    X->p = NULL;
}